

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialog::setProxyModel(QFileDialog *this,QAbstractProxyModel *proxyModel)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined4 *puVar4;
  QItemSelectionModel *pQVar5;
  QItemSelectionModel *pQVar6;
  void **ppvVar7;
  void **ppvVar8;
  QObject *pQVar9;
  long in_FS_OFFSET;
  QObject local_a8 [8];
  Connection local_a0;
  QObject local_98 [8];
  QObject local_90 [8];
  code *local_88;
  undefined1 *puStack_80;
  QAbstractItemModel *local_78;
  code *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x370) == 0 || *(char *)(lVar1 + 0x2c8) != '\0') ||
      (proxyModel == (QAbstractProxyModel *)0x0 &&
       *(QAbstractProxyModel **)(lVar1 + 0x2e0) == (QAbstractProxyModel *)0x0)) ||
     (*(QAbstractProxyModel **)(lVar1 + 0x2e0) == proxyModel)) goto LAB_004eb698;
  local_78 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex
            ((QModelIndex *)&local_68,*(QAbstractItemView **)(*(long *)(lVar1 + 0x370) + 0x88));
  plVar2 = *(long **)(lVar1 + 0x2e0);
  if (plVar2 == (long *)0x0) {
    local_78 = local_58.ptr;
    local_88 = local_68;
    puStack_80 = puStack_60;
LAB_004eb255:
    pQVar9 = *(QObject **)(lVar1 + 0x300);
  }
  else {
    (**(code **)(*plVar2 + 400))(&local_88,plVar2,&local_68);
    pQVar9 = *(QObject **)(lVar1 + 0x2e0);
    if (pQVar9 == (QObject *)0x0) goto LAB_004eb255;
  }
  local_68 = QAbstractItemModel::rowsInserted;
  puStack_60 = (undefined1 *)0x0;
  local_48 = QFileDialogPrivate::rowsInserted;
  local_40 = (ImplFn)0x0;
  QObject::disconnectImpl
            (pQVar9,&local_68,*(QObject **)(lVar1 + 8),&local_48,
             (QMetaObject *)&QAbstractItemModel::staticMetaObject);
  if (proxyModel == (QAbstractProxyModel *)0x0) {
    *(undefined8 *)(lVar1 + 0x2e0) = 0;
    plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0x88);
    (**(code **)(*plVar2 + 0x1c8))(plVar2,*(undefined8 *)(lVar1 + 0x300));
    plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0xa0);
    (**(code **)(*plVar2 + 0x1c8))(plVar2,*(undefined8 *)(lVar1 + 0x300));
    QCompleter::setModel(*(QCompleter **)(lVar1 + 0x308),*(QAbstractItemModel **)(lVar1 + 0x300));
    ppvVar8 = *(void ***)(lVar1 + 0x300);
    lVar3 = *(long *)(lVar1 + 0x308);
    *(void ***)(lVar3 + 0x18) = ppvVar8;
    *(undefined8 *)(lVar3 + 0x10) = 0;
    local_68 = QAbstractItemModel::rowsInserted;
    puStack_60 = (undefined1 *)0x0;
    local_48 = QFileDialogPrivate::rowsInserted;
    local_40 = (ImplFn)0x0;
    ppvVar7 = *(void ***)(lVar1 + 8);
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = QFileDialogPrivate::rowsInserted;
    *(undefined8 *)(puVar4 + 6) = 0;
    pQVar9 = local_98;
  }
  else {
    QObject::setParent((QObject *)proxyModel);
    *(QAbstractProxyModel **)(lVar1 + 0x2e0) = proxyModel;
    (**(code **)(*(long *)proxyModel + 0x188))(proxyModel,*(undefined8 *)(lVar1 + 0x300));
    plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0x88);
    (**(code **)(*plVar2 + 0x1c8))(plVar2,*(undefined8 *)(lVar1 + 0x2e0));
    plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0xa0);
    (**(code **)(*plVar2 + 0x1c8))(plVar2,*(undefined8 *)(lVar1 + 0x2e0));
    QCompleter::setModel(*(QCompleter **)(lVar1 + 0x308),*(QAbstractItemModel **)(lVar1 + 0x2e0));
    ppvVar8 = *(void ***)(lVar1 + 0x2e0);
    *(void ***)(*(long *)(lVar1 + 0x308) + 0x10) = ppvVar8;
    local_68 = QAbstractItemModel::rowsInserted;
    puStack_60 = (undefined1 *)0x0;
    local_48 = QFileDialogPrivate::rowsInserted;
    local_40 = (ImplFn)0x0;
    ppvVar7 = *(void ***)(lVar1 + 8);
    puVar4 = (undefined4 *)operator_new(0x20);
    *puVar4 = 1;
    *(code **)(puVar4 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar4 + 4) = QFileDialogPrivate::rowsInserted;
    *(undefined8 *)(puVar4 + 6) = 0;
    pQVar9 = local_90;
  }
  QObject::connectImpl
            (pQVar9,ppvVar8,(QObject *)&local_68,ppvVar7,(QSlotObjectBase *)&local_48,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)pQVar9);
  pQVar5 = QAbstractItemView::selectionModel
                     (*(QAbstractItemView **)(*(long *)(lVar1 + 0x370) + 0xa0));
  plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0xa0);
  pQVar6 = QAbstractItemView::selectionModel
                     (*(QAbstractItemView **)(*(long *)(lVar1 + 0x370) + 0x88));
  (**(code **)(*plVar2 + 0x1d0))(plVar2,pQVar6);
  local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  plVar2 = *(long **)(lVar1 + 0x2e0);
  if (plVar2 == (long *)0x0) {
    local_58.ptr = local_78;
    local_68 = local_88;
    puStack_60 = puStack_80;
  }
  else {
    (**(code **)(*plVar2 + 0x198))(&local_68,plVar2,&local_88);
  }
  plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0xa0);
  (**(code **)(*plVar2 + 0x218))(plVar2,&local_68);
  plVar2 = *(long **)(*(long *)(lVar1 + 0x370) + 0x88);
  (**(code **)(*plVar2 + 0x218))(plVar2,&local_68);
  pQVar6 = QAbstractItemView::selectionModel
                     (*(QAbstractItemView **)(*(long *)(lVar1 + 0x370) + 0x88));
  local_68 = QItemSelectionModel::selectionChanged;
  puStack_60 = (undefined1 *)0x0;
  local_48 = QFileDialogPrivate::selectionChanged;
  local_40 = (ImplFn)0x0;
  ppvVar8 = *(void ***)(lVar1 + 8);
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = QFileDialogPrivate::selectionChanged;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_a0,(void **)pQVar6,(QObject *)&local_68,ppvVar8,
             (QSlotObjectBase *)&local_48,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_a0);
  local_68 = QItemSelectionModel::currentChanged;
  puStack_60 = (undefined1 *)0x0;
  local_48 = QFileDialogPrivate::currentChanged;
  local_40 = (ImplFn)0x0;
  ppvVar8 = *(void ***)(lVar1 + 8);
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = QFileDialogPrivate::currentChanged;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_a8,(void **)pQVar6,(QObject *)&local_68,ppvVar8,(QSlotObjectBase *)&local_48,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  if (pQVar5 != (QItemSelectionModel *)0x0) {
    (**(code **)(*(long *)pQVar5 + 0x20))();
  }
LAB_004eb698:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setProxyModel(QAbstractProxyModel *proxyModel)
{
    Q_D(QFileDialog);
    if (!d->usingWidgets())
        return;
    if ((!proxyModel && !d->proxyModel)
        || (proxyModel == d->proxyModel))
        return;

    QModelIndex idx = d->rootIndex();
    if (d->proxyModel)
        QObjectPrivate::disconnect(d->proxyModel, &QAbstractProxyModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);
    else
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);

    if (proxyModel != nullptr) {
        proxyModel->setParent(this);
        d->proxyModel = proxyModel;
        proxyModel->setSourceModel(d->model);
        d->qFileDialogUi->listView->setModel(d->proxyModel);
        d->qFileDialogUi->treeView->setModel(d->proxyModel);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->proxyModel);
        d->completer->proxyModel = d->proxyModel;
#endif
        QObjectPrivate::connect(d->proxyModel, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    } else {
        d->proxyModel = nullptr;
        d->qFileDialogUi->listView->setModel(d->model);
        d->qFileDialogUi->treeView->setModel(d->model);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->model);
        d->completer->sourceModel = d->model;
        d->completer->proxyModel = nullptr;
#endif
        QObjectPrivate::connect(d->model, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    }
    QScopedPointer<QItemSelectionModel> selModel(d->qFileDialogUi->treeView->selectionModel());
    d->qFileDialogUi->treeView->setSelectionModel(d->qFileDialogUi->listView->selectionModel());

    d->setRootIndex(idx);

    // reconnect selection
    QItemSelectionModel *selections = d->qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            d, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            d, &QFileDialogPrivate::currentChanged);
}